

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

stTimeout_t * AllocTimeout(int iSize)

{
  stTimeout_t *psVar1;
  stTimeoutItemLink_t *psVar2;
  unsigned_long_long uVar3;
  stTimeout_t *lp;
  int iSize_local;
  
  psVar1 = (stTimeout_t *)calloc(1,0x20);
  psVar1->iItemSize = iSize;
  psVar2 = (stTimeoutItemLink_t *)calloc(1,(long)psVar1->iItemSize << 4);
  psVar1->pItems = psVar2;
  uVar3 = GetTickMS();
  psVar1->ullStart = uVar3;
  psVar1->llStartIdx = 0;
  return psVar1;
}

Assistant:

stTimeout_t *AllocTimeout( int iSize )
{
	stTimeout_t *lp = (stTimeout_t*)calloc( 1,sizeof(stTimeout_t) );	

	lp->iItemSize = iSize;
	lp->pItems = (stTimeoutItemLink_t*)calloc( 1,sizeof(stTimeoutItemLink_t) * lp->iItemSize );

	lp->ullStart = GetTickMS();
	lp->llStartIdx = 0;

	return lp;
}